

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdpc.c
# Opt level: O2

void hdpc_generate_mat_specexact(m256v *H,parameters *P)

{
  int n_row;
  uint8_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint8_t *memory;
  uint8_t *memory_00;
  ulong uVar4;
  int j_1;
  ulong uVar5;
  int n_col;
  uint uVar6;
  ulong uVar7;
  int j;
  long lVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  m256v MT;
  m256v GAMMA;
  m256v I_H;
  m256v G_HDPC;
  
  n_col = P->S + P->Kprime;
  n_row = P->H;
  memory = (uint8_t *)malloc((long)(n_col * n_row));
  m256v_make(&MT,n_row,n_col,memory);
  m256v_clear(&MT);
  lVar8 = 0;
  while (lVar8 < P->Kprime + P->S + -1) {
    uVar3 = (uint32_t)(lVar8 + 1);
    uVar2 = Rand(uVar3,6,P->H);
    uVar3 = Rand(uVar3,7,P->H + -1);
    uVar6 = P->H;
    MT.e[lVar8 + (long)(int)uVar2 * MT.rstride] = '\x01';
    MT.e[lVar8 + (long)(int)((uVar3 + uVar2 + 1) % uVar6) * MT.rstride] = '\x01';
    lVar8 = lVar8 + 1;
  }
  uVar1 = '\x01';
  for (lVar8 = 0; uVar6 = P->S + P->Kprime, lVar8 < P->H; lVar8 = lVar8 + 1) {
    MT.e[(long)(int)uVar6 + -1 + MT.rstride * lVar8] = uVar1;
    uVar1 = gf256_mul(uVar1,'\x02');
  }
  memory_00 = (uint8_t *)malloc((ulong)(uVar6 * uVar6));
  m256v_make(&GAMMA,uVar6,uVar6,memory_00);
  m256v_clear(&GAMMA);
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar6) {
    uVar7 = (ulong)uVar6;
  }
  uVar10 = (ulong)uVar6;
  uVar1 = '\x01';
  for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    uVar5 = uVar9;
    for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
      GAMMA.e[uVar4 + GAMMA.rstride * uVar5] = uVar1;
      uVar5 = uVar5 + 1;
    }
    uVar1 = gf256_mul(uVar1,'\x02');
    uVar10 = uVar10 - 1;
  }
  m256v_get_subview(&G_HDPC,H,0,0,P->H,P->S + P->Kprime);
  m256v_mul(&MT,&GAMMA,&G_HDPC);
  m256v_get_subview(&I_H,H,0,P->S + P->Kprime,P->H,P->H);
  m256v_clear(&I_H);
  for (lVar8 = 0; lVar8 < P->H; lVar8 = lVar8 + 1) {
    I_H.e[lVar8 + I_H.rstride * lVar8] = '\x01';
  }
  free(memory_00);
  free(memory);
  return;
}

Assistant:

void hdpc_generate_mat_specexact(m256v* H, const parameters* P)
{
	assert(H->n_row == P->H);
	assert(H->n_col == P->L);

	/* Create the MT matrix */
	uint8_t* mt = malloc(P->H * (P->Kprime + P->S));
	m256v MT = m256v_make(P->H, P->Kprime + P->S, mt);
	m256v_clear(&MT);
	for (int j = 0; j < P->Kprime + P->S - 1; ++j) {
		uint32_t a = Rand(j + 1, 6, P->H);
		uint32_t b = (a + Rand(j + 1, 7, P->H - 1) + 1) % P->H;
		m256v_set_el(&MT, a, j, 1);
		m256v_set_el(&MT, b, j, 1);
	}
	uint8_t val = 1;
	for (int j = 0; j < P->H; ++j) {
		m256v_set_el(&MT, j, P->Kprime + P->S - 1, val);
		val = gf256_mul(val, 2);
	}

	/* Create the GAMMA matrix */
	const int d = P->Kprime + P->S;
	uint8_t* gamma = malloc(d * d);
	m256v GAMMA = m256v_make(d, d, gamma);
	m256v_clear(&GAMMA);

	val = 1;
	for (int i = 0; i < d; ++i) {
		for (int j = i; j < d; ++j) {
			m256v_set_el(&GAMMA, j, j - i, val);
		}
		val = gf256_mul(val, 2);
	}

	/* Place the product MT * GAMMA into the G_HDPC matrix */
	m256v G_HDPC = m256v_get_subview(H, 0, 0, P->H, P->Kprime + P->S);
	m256v_mul(&MT, &GAMMA, &G_HDPC);

	/* Write the diagonal matrix I_H */
	m256v I_H = m256v_get_subview(H, 0, P->Kprime + P->S, P->H, P->H);
	m256v_clear(&I_H);
	for (int i = 0; i < P->H; ++i) {
		m256v_set_el(&I_H, i, i, 1);
	}

	/* Free temp space */
	free(gamma);
	free(mt);
}